

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strength_reduction_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::StrengthReductionPass::ReplaceMultiplyByPowerOf2
          (StrengthReductionPass *this,iterator *inst)

{
  IRContext *pIVar1;
  uint uVar2;
  bool bVar3;
  uint32_t uVar4;
  uint uVar5;
  array<signed_char,_4UL> aVar6;
  uint32_t uVar7;
  Instruction *pIVar8;
  Operand *__x;
  Instruction *this_00;
  ulong uVar9;
  int i;
  uint uVar10;
  bool bVar11;
  bool bVar12;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  newInstruction;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> newOperands;
  Operand shiftOperand;
  undefined1 local_b0 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_90;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_88;
  StrengthReductionPass *local_70;
  iterator local_68;
  undefined1 local_60 [40];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_38;
  
  pIVar8 = (inst->super_iterator).node_;
  if (pIVar8->opcode_ != OpIMul) {
    __assert_fail("(*inst)->opcode() == spv::Op::OpIMul && \"Only works for multiplication of integers.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/strength_reduction_pass.cpp"
                  ,0x45,
                  "bool spvtools::opt::StrengthReductionPass::ReplaceMultiplyByPowerOf2(BasicBlock::iterator *)"
                 );
  }
  uVar4 = 0;
  if (pIVar8->has_type_id_ == true) {
    uVar4 = Instruction::GetSingleWordOperand(pIVar8,0);
  }
  if (uVar4 != *(uint32_t *)&(this->super_Pass).field_0x34) {
    pIVar8 = (inst->super_iterator).node_;
    uVar4 = 0;
    if (pIVar8->has_type_id_ == true) {
      uVar4 = Instruction::GetSingleWordOperand(pIVar8,0);
    }
    if (uVar4 != this->uint32_type_id_) {
      return false;
    }
  }
  bVar3 = false;
  uVar10 = 0;
  local_70 = this;
  do {
    pIVar8 = (inst->super_iterator).node_;
    uVar5 = (pIVar8->has_result_id_ & 1) + 1;
    if (pIVar8->has_type_id_ == false) {
      uVar5 = (uint)pIVar8->has_result_id_;
    }
    uVar4 = Instruction::GetSingleWordOperand(pIVar8,uVar5 + uVar10);
    pIVar1 = (this->super_Pass).context_;
    if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar1);
    }
    pIVar8 = analysis::DefUseManager::GetDef
                       ((pIVar1->def_use_mgr_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                        .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                        _M_head_impl,uVar4);
    bVar11 = true;
    if (pIVar8->opcode_ == OpConstant) {
      uVar5 = Instruction::GetSingleWordOperand(pIVar8,2);
      bVar11 = uVar5 == 0;
      bVar12 = (uVar5 & uVar5 - 1) != 0;
      if (!bVar11 && !bVar12) {
        uVar4 = 0;
        if ((uVar5 & 1) == 0) {
          uVar4 = 0;
          uVar9 = (ulong)uVar5;
          do {
            uVar4 = uVar4 + 1;
            uVar9 = uVar9 >> 1;
            uVar2 = uVar5 & 2;
            uVar5 = (uint)uVar9;
          } while (uVar2 == 0);
        }
        aVar6._M_elems = (_Type)GetConstantId(this,uVar4);
        uVar4 = Pass::TakeNextId(&this->super_Pass);
        local_88.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_88.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        __x = Instruction::GetInOperand((inst->super_iterator).node_,uVar10 ^ 1);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                  (&local_88,__x);
        local_b0._0_8_ = &PTR__SmallVector_009488e0;
        local_b0._24_8_ = local_b0 + 0x10;
        local_90._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_b0._8_8_ = 1;
        local_60._0_4_ = SPV_OPERAND_TYPE_ID;
        local_60._8_8_ = &PTR__SmallVector_009488e0;
        local_60._16_8_ = 0;
        local_60._32_8_ = local_60 + 0x18;
        local_38._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_b0._16_4_ = aVar6._M_elems;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)(local_60 + 8),
                   (SmallVector<unsigned_int,_2UL> *)local_b0);
        local_b0._0_8_ = &PTR__SmallVector_009488e0;
        if (local_90._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_90,local_90._M_head_impl);
        }
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                  (&local_88,(value_type *)local_60);
        this_00 = (Instruction *)operator_new(0x70);
        this = local_70;
        pIVar1 = (local_70->super_Pass).context_;
        pIVar8 = (inst->super_iterator).node_;
        uVar7 = 0;
        if (pIVar8->has_type_id_ == true) {
          uVar7 = Instruction::GetSingleWordOperand(pIVar8,0);
        }
        Instruction::Instruction(this_00,pIVar1,OpShiftLeftLogical,uVar7,uVar4,&local_88);
        local_b0._0_8_ = this_00;
        InstructionList::iterator::InsertBefore
                  ((iterator *)&local_68,
                   (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    *)inst);
        (inst->super_iterator).node_ = local_68.node_;
        pIVar1 = (this->super_Pass).context_;
        if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
          IRContext::BuildDefUseManager(pIVar1);
        }
        analysis::DefUseManager::AnalyzeInstDefUse
                  ((pIVar1->def_use_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                   _M_head_impl,(inst->super_iterator).node_);
        pIVar8 = (((inst->super_iterator).node_)->
                 super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        (inst->super_iterator).node_ = pIVar8;
        pIVar1 = (this->super_Pass).context_;
        uVar7 = 0;
        if (pIVar8->has_result_id_ == true) {
          uVar7 = Instruction::GetSingleWordOperand(pIVar8,(uint)pIVar8->has_type_id_);
        }
        IRContext::ReplaceAllUsesWith(pIVar1,uVar7,uVar4);
        pIVar8 = (inst->super_iterator).node_;
        (inst->super_iterator).node_ =
             (pIVar8->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
        IRContext::KillInst((this->super_Pass).context_,pIVar8);
        if ((Instruction *)local_b0._0_8_ != (Instruction *)0x0) {
          (*((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_b0._0_8_)->
            _vptr_IntrusiveNodeBase[1])();
        }
        local_60._8_8_ = &PTR__SmallVector_009488e0;
        if (local_38._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_38,local_38._M_head_impl);
        }
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  (&local_88);
        bVar3 = true;
      }
      bVar11 = bVar11 || bVar12;
    }
  } while ((bVar11) && (bVar11 = uVar10 == 0, uVar10 = uVar10 + 1, bVar11));
  return bVar3;
}

Assistant:

bool StrengthReductionPass::ReplaceMultiplyByPowerOf2(
    BasicBlock::iterator* inst) {
  assert((*inst)->opcode() == spv::Op::OpIMul &&
         "Only works for multiplication of integers.");
  bool modified = false;

  // Currently only works on 32-bit integers.
  if ((*inst)->type_id() != int32_type_id_ &&
      (*inst)->type_id() != uint32_type_id_) {
    return modified;
  }

  // Check the operands for a constant that is a power of 2.
  for (int i = 0; i < 2; i++) {
    uint32_t opId = (*inst)->GetSingleWordInOperand(i);
    Instruction* opInst = get_def_use_mgr()->GetDef(opId);
    if (opInst->opcode() == spv::Op::OpConstant) {
      // We found a constant operand.
      uint32_t constVal = opInst->GetSingleWordOperand(2);

      if (IsPowerOf2(constVal)) {
        modified = true;
        uint32_t shiftAmount = CountTrailingZeros(constVal);
        uint32_t shiftConstResultId = GetConstantId(shiftAmount);

        // Create the new instruction.
        uint32_t newResultId = TakeNextId();
        std::vector<Operand> newOperands;
        newOperands.push_back((*inst)->GetInOperand(1 - i));
        Operand shiftOperand(spv_operand_type_t::SPV_OPERAND_TYPE_ID,
                             {shiftConstResultId});
        newOperands.push_back(shiftOperand);
        std::unique_ptr<Instruction> newInstruction(
            new Instruction(context(), spv::Op::OpShiftLeftLogical,
                            (*inst)->type_id(), newResultId, newOperands));

        // Insert the new instruction and update the data structures.
        (*inst) = (*inst).InsertBefore(std::move(newInstruction));
        get_def_use_mgr()->AnalyzeInstDefUse(&*(*inst));
        ++(*inst);
        context()->ReplaceAllUsesWith((*inst)->result_id(), newResultId);

        // Remove the old instruction.
        Instruction* inst_to_delete = &*(*inst);
        --(*inst);
        context()->KillInst(inst_to_delete);

        // We do not want to replace the instruction twice if both operands
        // are constants that are a power of 2.  So we break here.
        break;
      }
    }
  }

  return modified;
}